

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O1

void ctemplate::TemplateDictionary::SetupGlobalDict(void)

{
  TemplateString key;
  TemplateString key_00;
  TemplateString value;
  TemplateString value_00;
  uint7 uStack_97;
  uint7 uStack_77;
  uint7 uStack_57;
  uint7 uStack_37;
  
  global_dict_ = (small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::small_map_default_init<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>_>_>
                  *)operator_new(0xa8);
  global_dict_->size_ = 0;
  key.length_ = 8;
  key.ptr_ = "BI_SPACE";
  key._16_8_ = (ulong)uStack_37 << 8;
  key.id_ = 0;
  value.length_ = 1;
  value.ptr_ = " ";
  value._16_8_ = (ulong)uStack_57 << 8;
  value.id_ = 0;
  HashInsert<ctemplate::small_map<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ctemplate::TemplateString>>>,4,std::equal_to<unsigned_long>,ctemplate::small_map_default_init<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ctemplate::TemplateString>>>>>,ctemplate::TemplateString>
            (global_dict_,key,value);
  key_00.length_ = 10;
  key_00.ptr_ = "BI_NEWLINE";
  key_00._16_8_ = (ulong)uStack_77 << 8;
  key_00.id_ = 0;
  value_00.length_ = 1;
  value_00.ptr_ = "\n";
  value_00._16_8_ = (ulong)uStack_97 << 8;
  value_00.id_ = 0;
  HashInsert<ctemplate::small_map<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ctemplate::TemplateString>>>,4,std::equal_to<unsigned_long>,ctemplate::small_map_default_init<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ctemplate::TemplateString>>>>>,ctemplate::TemplateString>
            (global_dict_,key_00,value_00);
  empty_string_ = (undefined8 *)operator_new(0x20);
  *empty_string_ = "";
  empty_string_[1] = 0;
  *(undefined1 *)(empty_string_ + 2) = 0;
  empty_string_[3] = 0;
  return;
}

Assistant:

void TemplateDictionary::SetupGlobalDict()
    NO_THREAD_SAFETY_ANALYSIS {
  global_dict_ = new TemplateDictionary::GlobalDict;
  // Initialize the built-ins
  HashInsert(global_dict_, TemplateString("BI_SPACE"), TemplateString(" "));
  HashInsert(global_dict_, TemplateString("BI_NEWLINE"), TemplateString("\n"));
  // This is used for name-lookup misses.
  empty_string_ = new TemplateString("");
}